

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cc
# Opt level: O0

Expression __thiscall cnn::LSTMBuilder::add_input_impl(LSTMBuilder *this,int prev,Expression *x)

{
  reference pvVar1;
  int in_EDX;
  undefined8 extraout_RDX;
  long in_RSI;
  ComputationGraph *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  Expression EVar3;
  Expression ph_t;
  Expression i_ot;
  Expression i_aot;
  Expression i_crt;
  Expression i_nwt;
  Expression i_wt;
  Expression i_awt;
  Expression i_ft;
  Expression i_it;
  Expression i_ait;
  bool has_prev_state;
  Expression i_c_tm1;
  Expression i_h_tm1;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *vars;
  uint i;
  Expression in;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *ct;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *ht;
  initializer_list<cnn::expr::Expression> *in_stack_fffffffffffffb28;
  Expression *in_stack_fffffffffffffb30;
  allocator_type *in_stack_fffffffffffffb40;
  size_type in_stack_fffffffffffffb48;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_fffffffffffffb50;
  Expression *in_stack_fffffffffffffb60;
  Expression *in_stack_fffffffffffffb68;
  byte local_471;
  expr local_418 [32];
  undefined1 local_3f8 [16];
  initializer_list<cnn::expr::Expression> aiStack_3e8 [2];
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3a8 [16];
  Expression aEStack_398 [6];
  undefined1 *local_338;
  undefined8 local_330;
  expr local_2c8 [16];
  undefined1 local_2b8 [48];
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_268 [48];
  Expression aEStack_238 [2];
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_1c8 [16];
  Expression aEStack_1b8 [2];
  undefined1 *local_198;
  undefined8 local_190;
  undefined1 local_178 [112];
  undefined1 *local_108;
  undefined8 local_100;
  byte local_c1;
  reference local_a0;
  uint local_94;
  reference local_80;
  reference local_78;
  int local_14;
  undefined8 uVar2;
  
  local_14 = in_EDX;
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x5f151b);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::push_back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               *)in_stack_fffffffffffffb30,(value_type *)in_stack_fffffffffffffb28);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffb40);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x5f156b);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x5f159c);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::push_back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               *)in_stack_fffffffffffffb30,(value_type *)in_stack_fffffffffffffb28);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffb40);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x5f15e3);
  local_78 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     *)in_stack_fffffffffffffb30);
  local_80 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     *)in_stack_fffffffffffffb30);
  cnn::expr::Expression::Expression
            (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
  for (local_94 = 0; local_94 < *(uint *)(in_RSI + 0xc0); local_94 = local_94 + 1) {
    local_a0 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                             *)(in_RSI + 0x40),(ulong)local_94);
    cnn::expr::Expression::Expression((Expression *)0x5f167f);
    cnn::expr::Expression::Expression((Expression *)0x5f168c);
    local_471 = 1;
    if (local_14 < 0) {
      local_471 = *(byte *)(in_RSI + 0x88);
    }
    local_c1 = local_471 & 1;
    if (local_14 < 0) {
      if ((*(byte *)(in_RSI + 0x88) & 1) != 0) {
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   (in_RSI + 0x90),(ulong)local_94);
        cnn::expr::Expression::operator=
                  (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   (in_RSI + 0xa8),(ulong)local_94);
        cnn::expr::Expression::operator=
                  (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      }
    }
    else {
      pvVar1 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                             *)(in_RSI + 0x58),(long)local_14);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar1,(ulong)local_94);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      pvVar1 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                             *)(in_RSI + 0x70),(long)local_14);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar1,(ulong)local_94);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
    }
    if ((*(float *)(in_RSI + 0xc4) != 0.0) || (NAN(*(float *)(in_RSI + 0xc4)))) {
      cnn::expr::dropout(in_stack_fffffffffffffb68,(real)((ulong)in_stack_fffffffffffffb60 >> 0x20))
      ;
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
    }
    cnn::expr::Expression::Expression((Expression *)0x5f18a8);
    if ((local_c1 & 1) == 0) {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,3);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      in_stack_fffffffffffffb68 = aEStack_1b8;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,0);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      local_198 = local_1c8;
      local_190 = 3;
      cnn::expr::affine_transform(in_stack_fffffffffffffb28);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
    }
    else {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,3);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,0);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,1);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,2);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      local_108 = local_178;
      local_100 = 7;
      cnn::expr::affine_transform(in_stack_fffffffffffffb28);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
    }
    cnn::expr::logistic(in_stack_fffffffffffffb68);
    cnn::expr::operator-((real)((ulong)in_stack_fffffffffffffb68 >> 0x20),in_stack_fffffffffffffb60)
    ;
    cnn::expr::Expression::Expression((Expression *)0x5f1aec);
    if ((local_c1 & 1) == 0) {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,10);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      local_288 = local_2b8;
      local_280 = 3;
      cnn::expr::affine_transform(in_stack_fffffffffffffb28);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      __x = extraout_XMM0_Qa_00;
    }
    else {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,10);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      in_stack_fffffffffffffb60 = aEStack_238;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,9);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      local_218 = local_268;
      local_210 = 5;
      cnn::expr::affine_transform(in_stack_fffffffffffffb28);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      __x = extraout_XMM0_Qa;
    }
    cnn::expr::tanh(local_2c8,__x);
    if ((local_c1 & 1) == 0) {
      cnn::expr::cwise_multiply(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,(ulong)local_94);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
    }
    else {
      cnn::expr::cwise_multiply(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      cnn::expr::cwise_multiply(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      cnn::expr::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,(ulong)local_94);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
    }
    cnn::expr::Expression::Expression((Expression *)0x5f1d98);
    if ((local_c1 & 1) == 0) {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,7);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      in_stack_fffffffffffffb28 = aiStack_3e8;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,4);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      local_3c8 = local_3f8;
      local_3c0 = 3;
      cnn::expr::affine_transform(in_stack_fffffffffffffb28);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
    }
    else {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,7);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      in_stack_fffffffffffffb30 = aEStack_398;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,4);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,5);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_a0,6);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_80,(ulong)local_94);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
      local_338 = local_3a8;
      local_330 = 7;
      cnn::expr::affine_transform(in_stack_fffffffffffffb28);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
    }
    cnn::expr::logistic(in_stack_fffffffffffffb68);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_80,(ulong)local_94);
    cnn::expr::tanh(local_418,__x_00);
    cnn::expr::cwise_multiply(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_78,(ulong)local_94);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
  }
  if ((*(float *)(in_RSI + 0xc4) != 0.0) || (NAN(*(float *)(in_RSI + 0xc4)))) {
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::back
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_fffffffffffffb30);
    EVar3 = cnn::expr::dropout(in_stack_fffffffffffffb68,
                               (real)((ulong)in_stack_fffffffffffffb60 >> 0x20));
    uVar2 = EVar3._8_8_;
  }
  else {
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::back
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               in_stack_fffffffffffffb30);
    cnn::expr::Expression::Expression
              (in_stack_fffffffffffffb30,(Expression *)in_stack_fffffffffffffb28);
    uVar2 = extraout_RDX;
  }
  EVar3._8_8_ = uVar2;
  EVar3.pg = in_RDI;
  return EVar3;
}

Assistant:

Expression LSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // apply dropout according to http://arxiv.org/pdf/1409.2329v5.pdf
    if (dropout_rate) in = dropout(in, dropout_rate);
    // input
    Expression i_ait;
    if (has_prev_state)
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1, vars[C2I], i_c_tm1});
    else
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cwise_multiply(i_it,i_wt);
      Expression i_crt = cwise_multiply(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cwise_multiply(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state)
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1, vars[C2O], ct[i]});
    else
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cwise_multiply(i_ot,ph_t);
  }
  if (dropout_rate) return dropout(ht.back(), dropout_rate);
    else return ht.back();
}